

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

int __thiscall argo::reader::reader(reader *this,UI *ui,UI_STRING *uis)

{
  this->_vptr_reader = (_func_int **)&PTR__reader_00126d08;
  this->m_put_back = 1000;
  this->m_byte_index = 0;
  this->m_max_message_length = (size_t)ui;
  this->m_block_read = SUB81(uis,0);
  this->m_block_num_bytes = 0;
  this->m_block_index = -1;
  return 0;
}

Assistant:

reader::reader(size_t max_message_length, bool block_read) : 
            m_put_back(reader::no_put_back), 
            m_byte_index(0),
            m_max_message_length(max_message_length),
            m_block_read(block_read),
            m_block_num_bytes(0),
            m_block_index(-1)
{
}